

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::CodeHolder::reserveBuffer(CodeHolder *this,CodeBuffer *cb,size_t n)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Error EVar5;
  uint8_t *puVar6;
  long lVar7;
  
  EVar5 = 0;
  if ((cb->_capacity < n) && (EVar5 = 9, (cb->_flags & kIsFixed) == kNone)) {
    if ((cb->_data == (uint8_t *)0x0) || ((cb->_flags & kIsExternal) != kNone)) {
      puVar6 = (uint8_t *)malloc(n);
    }
    else {
      puVar6 = (uint8_t *)realloc(cb->_data,n);
    }
    if (puVar6 == (uint8_t *)0x0) {
      EVar5 = 1;
    }
    else {
      cb->_data = puVar6;
      cb->_capacity = n;
      uVar1 = *(uint *)&this->field_0xd0;
      if ((ulong)uVar1 != 0) {
        lVar2 = *(long *)&this->_emitters;
        lVar7 = 0;
        do {
          lVar3 = *(long *)(lVar2 + lVar7);
          if ((*(char *)(lVar3 + 8) == '\x01') &&
             ((CodeBuffer *)(*(long *)(lVar3 + 0x90) + 0x48) == cb)) {
            lVar4 = *(long *)(lVar3 + 0x98);
            *(uint8_t **)(lVar3 + 0x98) = puVar6;
            *(uint8_t **)(lVar3 + 0xa0) = puVar6 + n;
            *(uint8_t **)(lVar3 + 0xa8) = puVar6 + (*(long *)(lVar3 + 0xa8) - lVar4);
          }
          lVar7 = lVar7 + 8;
        } while ((ulong)uVar1 << 3 != lVar7);
      }
      EVar5 = 0;
    }
    return EVar5;
  }
  return EVar5;
}

Assistant:

Error CodeHolder::reserveBuffer(CodeBuffer* cb, size_t n) noexcept {
  size_t capacity = cb->capacity();

  if (n <= capacity)
    return kErrorOk;

  if (cb->isFixed())
    return DebugUtils::errored(kErrorTooLarge);

  return CodeHolder_reserveInternal(this, cb, n);
}